

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_v4addr_is_local_(in_addr *in)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = in->s_addr;
  uVar2 = uVar1 << 0x18;
  return (int)(((uVar2 & 0xf0000000) == 0xe0000000 || ((uVar1 & 0xff00) << 8 | uVar2) == 0xa9fe0000)
              || (uVar2 == 0x7f000000 || uVar1 == 0));
}

Assistant:

int
evutil_v4addr_is_local_(const struct in_addr *in)
{
	const ev_uint32_t addr = ntohl(in->s_addr);
	return addr == INADDR_ANY ||
		evutil_v4addr_is_localhost(addr) ||
		evutil_v4addr_is_linklocal(addr) ||
		evutil_v4addr_is_classd(addr);
}